

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DestroyMethod(sqlite3_vtab *pVtab)

{
  int iVar1;
  int rc;
  Fts5Table *pTab;
  sqlite3_vtab *pVtab_local;
  
  iVar1 = sqlite3Fts5DropAll((Fts5Config *)pVtab[1].pModule);
  if (iVar1 == 0) {
    fts5FreeVtab((Fts5FullTable *)pVtab);
  }
  return iVar1;
}

Assistant:

static int fts5DestroyMethod(sqlite3_vtab *pVtab){
  Fts5Table *pTab = (Fts5Table*)pVtab;
  int rc = sqlite3Fts5DropAll(pTab->pConfig);
  if( rc==SQLITE_OK ){
    fts5FreeVtab((Fts5FullTable*)pVtab);
  }
  return rc;
}